

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

ES5ArrayTypeHandlerBase<unsigned_short> * __thiscall
Js::PathTypeHandlerBase::ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
          (PathTypeHandlerBase *this,DynamicObject *instance)

{
  byte bVar1;
  ScriptContext *scriptContext;
  Recycler *this_00;
  DynamicType *oldType;
  TypePath *pTVar2;
  code *pcVar3;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar4;
  bool bVar5;
  bool usedAsFixed;
  PropertyTypes values;
  unsigned_short uVar6;
  int iVar7;
  undefined4 *puVar8;
  PathTypeHandlerBase *this_01;
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar9;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> *pRVar10;
  undefined4 extraout_var;
  PropertyRecord *propertyRecord;
  char *pcVar12;
  PropertyIndex i;
  ulong uVar13;
  Flags FVar14;
  undefined1 local_c0 [8];
  TrackAllocData data;
  DictionaryPropertyDescriptor<unsigned_short> *local_70;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  TypePath *local_60;
  Type *local_58;
  ES5ArrayTypeHandlerBase<unsigned_short> *local_50;
  uint local_44;
  ES5ArrayTypeHandlerBase<unsigned_short> *local_40;
  char local_31;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar11;
  
  local_50 = (ES5ArrayTypeHandlerBase<unsigned_short> *)instance;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x596,"(instance)","instance");
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  pEVar9 = local_50;
  scriptContext =
       (((((Type *)&(local_50->super_DictionaryTypeHandlerBase<unsigned_short>).
                    super_DynamicTypeHandler.propertyTypes)->ptr->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = scriptContext->recycler;
  (*((IRecyclerVisitedObject *)
    &(local_50->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.
     _vptr_DynamicTypeHandler)->_vptr_IRecyclerVisitedObject[0x68])(local_50);
  bVar5 = DynamicObject::DeoptimizeObjectHeaderInlining((DynamicObject *)pEVar9);
  this_01 = this;
  if ((bVar5) &&
     (this_01 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler((DynamicObject *)local_50),
     this_01 == (PathTypeHandlerBase *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5ae,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
    this_01 = (PathTypeHandlerBase *)0x0;
  }
  local_c0 = (undefined1  [8])&ES5ArrayTypeHandlerBase<unsigned_short>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9af3a56;
  data.filename._0_4_ = 0x5b0;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_c0);
  pEVar9 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
            (pEVar9,this_00,(this_01->super_DynamicTypeHandler).slotCapacity,
             (this_01->super_DynamicTypeHandler).inlineSlotCapacity,
             (this_01->super_DynamicTypeHandler).offsetOfInlineSlots);
  local_40 = pEVar9;
  bVar5 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)pEVar9);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5b2,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  pEVar9 = local_50;
  oldType = (DynamicType *)
            ((Type *)&(local_50->super_DictionaryTypeHandlerBase<unsigned_short>).
                      super_DynamicTypeHandler.propertyTypes)->ptr;
  oldSingletonInstanceBefore = GetSingletonInstance(this_01);
  pcVar12 = (char *)pEVar9;
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"converting",L"PathTypeHandler",L"DictionaryTypeHandler",(DynamicObject *)pEVar9,
             &this_01->super_DynamicTypeHandler,oldType,oldSingletonInstanceBefore);
  local_31 = DynamicTypeHandler::CanBeSingletonInstance((DynamicObject *)pEVar9);
  if ((!(bool)local_31) && (bVar5 = HasSingletonInstance(this_01), bVar5)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    pcVar12 = "canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()";
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5bd,
                                "(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance())"
                                ,"canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()"
                               );
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  bVar5 = HasSingletonInstanceOnlyIfNeeded(this_01);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    pcVar12 = "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()";
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5c9,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  if ((local_31 != '\0') && (bVar5 = DynamicTypeHandler::ShouldFixAnyProperties(), bVar5)) {
    pRVar10 = (((this_01->typePath).ptr)->singletonInstance).ptr;
    if ((pRVar10 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
       ((ES5ArrayTypeHandlerBase<unsigned_short> *)
        (pRVar10->super_RecyclerWeakReferenceBase).strongRef != local_50)) {
      pRVar10 = DynamicObject::CreateWeakReferenceToSelf((DynamicObject *)local_50);
    }
    DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)local_40,pRVar10);
  }
  if ((DAT_0145c365 == '\x01') && (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    pcVar12 = 
    "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
    ;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5df,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  bVar1 = (this_01->super_DynamicTypeHandler).flags;
  local_44 = (uint)CONCAT71((int7)((ulong)pcVar12 >> 8),1);
  if ((bVar1 & 0x20) == 0) {
    if ((bVar1 & 0x18) == 0) {
      local_44 = 0;
    }
    else {
      local_44 = (uint)CONCAT71(0x14302,DAT_0145c365) ^ 1;
    }
  }
  iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
  pDVar11 = (DictionaryPropertyDescriptor<unsigned_short> *)CONCAT44(extraout_var,iVar7);
  local_60 = (this_01->typePath).ptr;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_58 = &(local_40->super_DictionaryTypeHandlerBase<unsigned_short>).nextPropertyIndex;
  descriptor = pDVar11;
  for (uVar13 = 0; pEVar9 = local_50, uVar13 < (this_01->super_DynamicTypeHandler).unusedBytes >> 1;
      uVar13 = uVar13 + 1) {
    if (pDVar11 == (DictionaryPropertyDescriptor<unsigned_short> *)0x0) {
      FVar14 = IsAccessor|IsShadowed|PreventFalseReference;
    }
    else {
      FVar14 = (&pDVar11->flags)[uVar13];
    }
    propertyRecord = TypePath::GetPropertyId(local_60,(int)uVar13);
    local_c0 = (undefined1  [8])propertyRecord;
    if (FVar14 == ~IsInitialized) {
      bVar5 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->super_DictionaryTypeHandlerBase<unsigned_short>).propertyMap.
                            ptr,(PropertyRecord **)local_c0,&local_70);
      pDVar11 = descriptor;
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x5ef,"(result)","result");
        if (!bVar5) goto LAB_00c51789;
        *puVar8 = 0;
      }
      uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(local_70);
      if (((&pDVar11->flags)[uVar6] & IsOnlyOneAccessorInitialized) == None) {
        if (uVar13 != *local_58) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x5f4,"(i == newTypeHandler->nextPropertyIndex)",
                                      "i == newTypeHandler->nextPropertyIndex");
          if (!bVar5) goto LAB_00c51789;
          *puVar8 = 0;
        }
        ::Math::PostInc<unsigned_short>(local_58);
      }
      else {
        uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(local_70);
        iVar7 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x70])
                          (this_01,(ulong)uVar6);
        if (*local_58 != ((ushort)iVar7 & 0xff)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x5f8,
                                      "(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex)"
                                      ,
                                      "oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex"
                                     );
          if (!bVar5) goto LAB_00c51789;
          *puVar8 = 0;
        }
        DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter(local_70,local_58);
        DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)local_40);
      }
    }
    else if (DAT_0145c381 == '\x01') {
      data._32_8_ = ZEXT18(((local_60->data).ptr)->maxInitializedLength);
      if (local_31 == '\0') {
        bVar5 = false;
      }
      else {
        bVar5 = TypePath::GetIsFixedFieldAt
                          (local_60,(PropertyIndex)uVar13,
                           (uint)((this_01->super_DynamicTypeHandler).unusedBytes >> 1));
      }
      if ((char)local_44 == '\0') {
        usedAsFixed = false;
      }
      else {
        usedAsFixed = TypePath::GetIsUsedFixedFieldAt
                                (local_60,(PropertyIndex)uVar13,
                                 (uint)((this_01->super_DynamicTypeHandler).unusedBytes >> 1));
      }
      DictionaryTypeHandlerBase<unsigned_short>::Add
                (&local_40->super_DictionaryTypeHandlerBase<unsigned_short>,propertyRecord,
                 FVar14 & (IsInitialized|IsAccessor|IsShadowed|PreventFalseReference),
                 uVar13 < (ulong)data._32_8_,bVar5,usedAsFixed,scriptContext);
      pDVar11 = descriptor;
    }
    else {
      DictionaryTypeHandlerBase<unsigned_short>::Add
                (&local_40->super_DictionaryTypeHandlerBase<unsigned_short>,propertyRecord,
                 FVar14 & (IsInitialized|IsAccessor|IsShadowed|PreventFalseReference),true,false,
                 false,scriptContext);
      pDVar11 = descriptor;
    }
  }
  if (DAT_0145c381 != '\0') {
    bVar5 = HasSingletonInstanceOnlyIfNeeded(this_01);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x616,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                  "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar5) goto LAB_00c51789;
      *puVar8 = 0;
    }
    pTVar2 = (this_01->typePath).ptr;
    pRVar10 = (pTVar2->singletonInstance).ptr;
    if ((pRVar10 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((ES5ArrayTypeHandlerBase<unsigned_short> *)
        (pRVar10->super_RecyclerWeakReferenceBase).strongRef == pEVar9)) {
      (pTVar2->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  if ((DAT_0145c365 == '\x01') && (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x61d,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  if (((local_40->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
      0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x61e,"(!newTypeHandler->GetIsPrototype())",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  pEVar4 = local_40;
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)local_40,(this_01->super_DynamicTypeHandler).flags & 0x20);
  if (((pEVar4->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.
       propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x623,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar5) goto LAB_00c51789;
    *puVar8 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this_01->super_DynamicTypeHandler);
  pcVar12 = (char *)local_40;
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)local_40,0xb0,values);
  ES5ArrayTypeHandlerBase<unsigned_short>::SetInstanceTypeHandler
            ((ES5ArrayTypeHandlerBase<unsigned_short> *)pcVar12,(DynamicObject *)pEVar9,true);
  bVar5 = DictionaryTypeHandlerBase<unsigned_short>::HasSingletonInstance
                    ((DictionaryTypeHandlerBase<unsigned_short> *)pcVar12);
  if ((bVar5) &&
     (pcVar12 = (char *)pEVar9, bVar5 = DynamicObject::HasSharedType((DynamicObject *)pEVar9), bVar5
     )) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    pcVar12 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
    ;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x628,
                                "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                ,
                                "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                               );
    if (!bVar5) {
LAB_00c51789:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  pEVar4 = local_40;
  TraceFixedFieldsAfterTypeHandlerChange
            ((DynamicObject *)pcVar12,&this_01->super_DynamicTypeHandler,
             (DynamicTypeHandler *)local_40,oldType,
             (DynamicType *)
             ((Type *)&(pEVar9->super_DictionaryTypeHandlerBase<unsigned_short>).
                       super_DynamicTypeHandler.propertyTypes)->ptr,oldSingletonInstanceBefore);
  return pEVar4;
}

Assistant:

T* PathTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        instance->PrepareForConversionToNonPathType();

        PathTypeHandlerBase * oldTypeHandler;

        // Ideally 'this' and oldTypeHandler->GetTypeHandler() should be same
        // But we can have calls from external DOM objects, which requests us to replace the type of the
        // object with a new type. And in such cases, this API gets called with oldTypeHandler and the
        // new type (obtained from the External DOM object)
        // We use the duplicated typeHandler, if we deOptimized the object successfully, else we retain the earlier
        // behavior of using 'this' pointer.

        if (instance->DeoptimizeObjectHeaderInlining())
        {
            oldTypeHandler = reinterpret_cast<PathTypeHandlerBase *>(instance->GetTypeHandler());
        }
        else
        {
            oldTypeHandler = this;
        }

        Assert(oldTypeHandler);

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, oldTypeHandler->GetSlotCapacity(), oldTypeHandler->GetInlineSlotCapacity(), oldTypeHandler->GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = oldTypeHandler->GetSingletonInstance();
        oldTypeHandler->TraceFixedFieldsBeforeTypeHandlerChange(_u("converting"), _u("PathTypeHandler"), _u("DictionaryTypeHandler"), instance, oldTypeHandler, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance());

        // This instance may not be the singleton instance for this handler. There may be a singleton at the tip
        // and this instance may be getting initialized via an object literal and one of the properties may
        // be an accessor.  In this case we will convert to a DictionaryTypeHandler and it's correct to
        // transfer this instance, even tough different from the singleton. Ironically, this instance
        // may even appear to be at the tip along with the other singleton, because the set of properties (by
        // name, not value) may be identical.
        // Consider: Consider threading PropertyOperation_Init through InitProperty and SetAccessors,
        // to be sure that we don't assert only in this narrow case.
        // Assert(this->typePath->GetSingletonInstance() == instance);

        Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());

        // Don't install stack instance as singleton instance
        if (canBeSingletonInstance)
        {
            if (DynamicTypeHandler::AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = oldTypeHandler->GetTypePath()->GetSingletonInstance();
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        bool transferFixed = canBeSingletonInstance;

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.  See point 4 in ConvertToSimpleDictionaryType.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        bool transferUsedAsFixed = ((oldTypeHandler->GetFlags() & IsPrototypeFlag) != 0 || (oldTypeHandler->GetIsOrMayBecomeShared() && !DynamicTypeHandler::IsolatePrototypes()));
#endif

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        TypePath * typePath = oldTypeHandler->GetTypePath();
        for (PropertyIndex i = 0; i < oldTypeHandler->GetPathLength(); i++)
        {
            ObjectSlotAttributes attr = attributes ? attributes[i] : ObjectSlotAttr_Default;
            const PropertyRecord * propertyRecord = typePath->GetPropertyId(i);
            if (attr == ObjectSlotAttr_Setter)
            {
                // Adding a setter. Don't add another descriptor. Find the getter and convert its descriptor, which will cause
                // the setter to get the next free slot.
                DictionaryPropertyDescriptor<PropertyIndex> *descriptor;
                bool result = newTypeHandler->propertyMap->TryGetReference(propertyRecord, &descriptor);
                Assert(result);
                if (!(attributes[descriptor->GetDataPropertyIndex<false>()] & ObjectSlotAttr_Accessor))
                {
                    // Setter without a getter; this is a stale entry, so ignore it
                    // Just consume the slot so no descriptor refers to it.
                    Assert(i == newTypeHandler->nextPropertyIndex);
                    ::Math::PostInc(newTypeHandler->nextPropertyIndex);
                    continue;
                }
                Assert(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex);
                descriptor->ConvertToGetterSetter(newTypeHandler->nextPropertyIndex);
                newTypeHandler->ClearHasOnlyWritableDataProperties();
            }
            else
            {
#if ENABLE_FIXED_FIELDS
                // Consider: As noted in point 2 in ConvertToSimpleDictionaryType, when converting to non-shared handler we could be more
                // aggressive and mark every field as fixed, because we will always take a type transition. We have to remember to respect
                // the switches as to which kinds of properties we should fix, and for that we need the values from the instance. Even if
                // the type handler says the property is initialized, the current instance may not have a value for it. Check for value != null.
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr),
                        i < typePath->GetMaxInitializedLength(),
                        transferFixed && typePath->GetIsFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        transferUsedAsFixed && typePath->GetIsUsedFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        scriptContext);
                }
                else
#endif
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr), true, false, false, scriptContext);
                }
            }
        }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (PathTypeHandlerBase::FixPropsOnPathTypes())
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            oldTypeHandler->GetTypePath()->ClearSingletonInstanceIfSame(instance);
        }
#endif

        // PathTypeHandlers are always shared, so if we're isolating prototypes, a PathTypeHandler should
        // never have the prototype flag set.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        AssertMsg(!newTypeHandler->GetIsPrototype(), "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, oldTypeHandler->GetFlags());

        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, oldTypeHandler->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange(instance, oldTypeHandler, newTypeHandler, oldType, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

        return newTypeHandler;
    }